

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

int128_t * primecount::pi_gourdon(int128_t x,int threads)

{
  long lVar1;
  ulong uVar2;
  long in_RSI;
  ulong in_RDI;
  bool in_stack_00000053;
  int in_stack_00000054;
  int64_t in_stack_00000058;
  undefined1 in_stack_0000029b;
  int in_stack_0000029c;
  undefined1 in_stack_000002a0 [16];
  undefined8 local_18;
  
  if (in_RSI < 0) {
    local_18 = (int128_t *)0x0;
  }
  else {
    uVar2 = anon_unknown.dwarf_18cc2::pstd::numeric_limits<long>::max();
    lVar1 = ((long)uVar2 >> 0x3f) - in_RSI;
    if ((SBORROW8((long)uVar2 >> 0x3f,in_RSI) != SBORROW8(lVar1,(ulong)(uVar2 < in_RDI))) ==
        (long)(lVar1 - (ulong)(uVar2 < in_RDI)) < 0) {
      is_print();
      local_18 = (int128_t *)pi_gourdon_64(in_stack_00000058,in_stack_00000054,in_stack_00000053);
    }
    else {
      is_print();
      local_18 = pi_gourdon_128((int128_t)in_stack_000002a0,in_stack_0000029c,
                                (bool)in_stack_0000029b);
    }
  }
  return local_18;
}

Assistant:

int128_t pi_gourdon(int128_t x, int threads)
{
  // Prevent 64-bit cast to random
  // integer if x <= -2^63.
  if (x < 0)
    return 0;

  // Use 64-bit if possible
  if (x <= pstd::numeric_limits<int64_t>::max())
    return pi_gourdon_64((int64_t) x, threads);
  else
    return pi_gourdon_128(x, threads);
}